

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walMerge(u32 *aContent,ht_slot *aLeft,int nLeft,ht_slot **paRight,int *pnRight,ht_slot *aTmp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long *in_RCX;
  int in_EDX;
  int iVar4;
  void *in_RSI;
  long in_RDI;
  int *in_R8;
  void *in_R9;
  Pgno dbpage;
  ht_slot logpage;
  ht_slot *aRight;
  int nRight;
  int iOut;
  int iRight;
  int iLeft;
  ushort local_4a;
  int local_3c;
  int local_38;
  int local_34;
  
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  iVar1 = *in_R8;
  lVar3 = *in_RCX;
  while (local_38 < iVar1 || local_34 < in_EDX) {
    if ((local_34 < in_EDX) &&
       ((iVar1 <= local_38 ||
        (*(uint *)(in_RDI + (ulong)*(ushort *)((long)in_RSI + (long)local_34 * 2) * 4) <
         *(uint *)(in_RDI + (ulong)*(ushort *)(lVar3 + (long)local_38 * 2) * 4))))) {
      local_4a = *(ushort *)((long)in_RSI + (long)local_34 * 2);
      local_34 = local_34 + 1;
    }
    else {
      local_4a = *(ushort *)(lVar3 + (long)local_38 * 2);
      local_38 = local_38 + 1;
    }
    iVar2 = *(int *)(in_RDI + (ulong)local_4a * 4);
    iVar4 = local_3c + 1;
    *(ushort *)((long)in_R9 + (long)local_3c * 2) = local_4a;
    local_3c = iVar4;
    if ((local_34 < in_EDX) &&
       (*(int *)(in_RDI + (ulong)*(ushort *)((long)in_RSI + (long)local_34 * 2) * 4) == iVar2)) {
      local_34 = local_34 + 1;
    }
  }
  *in_RCX = (long)in_RSI;
  *in_R8 = local_3c;
  memcpy(in_RSI,in_R9,(long)local_3c << 1);
  return;
}

Assistant:

static void walMerge(
  const u32 *aContent,            /* Pages in wal - keys for the sort */
  ht_slot *aLeft,                 /* IN: Left hand input list */
  int nLeft,                      /* IN: Elements in array *paLeft */
  ht_slot **paRight,              /* IN/OUT: Right hand input list */
  int *pnRight,                   /* IN/OUT: Elements in *paRight */
  ht_slot *aTmp                   /* Temporary buffer */
){
  int iLeft = 0;                  /* Current index in aLeft */
  int iRight = 0;                 /* Current index in aRight */
  int iOut = 0;                   /* Current index in output buffer */
  int nRight = *pnRight;
  ht_slot *aRight = *paRight;

  assert( nLeft>0 && nRight>0 );
  while( iRight<nRight || iLeft<nLeft ){
    ht_slot logpage;
    Pgno dbpage;

    if( (iLeft<nLeft)
     && (iRight>=nRight || aContent[aLeft[iLeft]]<aContent[aRight[iRight]])
    ){
      logpage = aLeft[iLeft++];
    }else{
      logpage = aRight[iRight++];
    }
    dbpage = aContent[logpage];

    aTmp[iOut++] = logpage;
    if( iLeft<nLeft && aContent[aLeft[iLeft]]==dbpage ) iLeft++;

    assert( iLeft>=nLeft || aContent[aLeft[iLeft]]>dbpage );
    assert( iRight>=nRight || aContent[aRight[iRight]]>dbpage );
  }

  *paRight = aLeft;
  *pnRight = iOut;
  memcpy(aLeft, aTmp, sizeof(aTmp[0])*iOut);
}